

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteDot.c
# Opt level: O0

int Abc_NtkCountLogicNodes(Vec_Ptr_t *vNodes)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  int local_20;
  int local_1c;
  int Counter;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Vec_PtrSize(vNodes), local_1c < iVar1; local_1c = local_1c + 1) {
    pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,local_1c);
    iVar1 = Abc_ObjIsNode(pObj_00);
    if ((iVar1 != 0) &&
       ((iVar1 = Abc_ObjFaninNum(pObj_00), iVar1 != 0 ||
        (iVar1 = Abc_ObjFanoutNum(pObj_00), iVar1 != 0)))) {
      local_20 = local_20 + 1;
    }
  }
  return local_20;
}

Assistant:

int Abc_NtkCountLogicNodes( Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pObj;
    int i, Counter = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        if ( !Abc_ObjIsNode(pObj) )
            continue;
        if ( Abc_ObjFaninNum(pObj) == 0 && Abc_ObjFanoutNum(pObj) == 0 )
            continue;
        Counter ++;
    }
    return Counter;
}